

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_server.cpp
# Opt level: O3

MPP_RET wait_task(MppDevMppService *ctx,RK_S64 timeout)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long lVar3;
  long *plVar4;
  undefined8 *puVar5;
  MPP_RET MVar6;
  
  puVar2 = (undefined8 *)ctx->serv_ctx;
  if (puVar2 == (undefined8 *)0x0) {
    _mpp_log_l(2,"mpp_server","invalid ctx %p send task\n","wait_task",ctx);
    MVar6 = MPP_NOK;
  }
  else {
    puVar5 = (undefined8 *)puVar2[3] + -2;
    if (((undefined8 *)puVar2[3] == puVar2 + 3) &&
       (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,"task","wait_task",
                   0x205), puVar5 = (undefined8 *)0x0, (mpp_debug._3_1_ & 0x10) != 0)) {
LAB_00174099:
      abort();
    }
    pthread_mutex_lock((pthread_mutex_t *)*puVar2);
    if (*(uint *)((long)puVar2 + 0x4c) != *(uint *)(puVar2 + 10)) {
      if (((byte)mpp_server_debug & 1) != 0) {
        _mpp_log_l(4,"mpp_server","session %d wait %d start %d:%d\n",(char *)0x0,
                   (ulong)*(uint *)(puVar2 + 9),(ulong)*(uint *)((long)puVar5 + 0x44),
                   (ulong)*(uint *)((long)puVar2 + 0x4c),(ulong)*(uint *)(puVar2 + 10));
      }
      pthread_cond_wait((pthread_cond_t *)((pthread_mutex_t *)*puVar2 + 1),
                        (pthread_mutex_t *)*puVar2);
    }
    if (((byte)mpp_server_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_server","session %d wait %d done %d:%d\n",(char *)0x0,
                 (ulong)*(uint *)(puVar2 + 9),(ulong)*(uint *)((long)puVar5 + 0x44),
                 (ulong)*(uint *)((long)puVar2 + 0x4c),(ulong)*(uint *)(puVar2 + 10));
    }
    pthread_mutex_unlock((pthread_mutex_t *)*puVar2);
    puVar1 = puVar5 + 2;
    lVar3 = puVar5[2];
    plVar4 = (long *)puVar5[3];
    *(long **)(lVar3 + 8) = plVar4;
    *plVar4 = lVar3;
    puVar5[3] = puVar1;
    plVar4 = (long *)puVar2[6];
    puVar2[6] = puVar1;
    puVar5[2] = puVar2 + 5;
    puVar5[3] = plVar4;
    *plVar4 = (long)puVar1;
    MVar6 = MPP_OK;
    if (*(int *)((long)puVar2 + 0x4c) != *(int *)(puVar2 + 10)) {
      MVar6 = MPP_OK;
      _mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "session->task_wait == session->task_done","wait_task",0x214);
      if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00174099;
    }
  }
  return MVar6;
}

Assistant:

MPP_RET wait_task(MppDevMppService *ctx, RK_S64 timeout)
{
    RK_S32 ret = MPP_OK;
    MppDevTask *task = NULL;
    MppDevSession *session = (MppDevSession *)ctx->serv_ctx;
    (void) timeout;

    if (NULL == session) {
        mpp_err_f("invalid ctx %p send task\n", ctx);
        return MPP_NOK;
    }

    task = list_first_entry_or_null(&session->list_wait, MppDevTask, link_session);
    mpp_assert(task);

    session->cond->lock();
    if (session->task_wait != session->task_done) {
        mpp_serv_dbg_flow("session %d wait %d start %d:%d\n", session->client,
                          task->task_id, session->task_wait, session->task_done);
        session->cond->wait();
    }
    mpp_serv_dbg_flow("session %d wait %d done %d:%d\n", session->client,
                      task->task_id, session->task_wait, session->task_done);
    session->cond->unlock();

    list_del_init(&task->link_session);
    list_add_tail(&task->link_session, &session->list_done);

    mpp_assert(session->task_wait == session->task_done);

    return (MPP_RET)ret;
}